

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O1

void __thiscall
slang::ast::RandSeqProductionSymbol::visitExprs<slang::ast::CheckerMemberVisitor&>
          (RandSeqProductionSymbol *this,CheckerMemberVisitor *visitor)

{
  pointer pRVar1;
  pointer ppPVar2;
  size_t sVar3;
  ProdBase *pPVar4;
  long lVar5;
  long lVar6;
  Expression *pEVar7;
  pointer pRVar8;
  pointer ppPVar9;
  long lVar10;
  long *plVar11;
  CaseItem *item;
  long *plVar12;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> sVar13;
  Rule *rule;
  
  sVar13 = getRules(this);
  pRVar8 = sVar13._M_ptr;
  if (sVar13._M_extent._M_extent_value._M_extent_value != 0) {
    pRVar1 = pRVar8 + sVar13._M_extent._M_extent_value._M_extent_value;
    do {
      sVar3 = (pRVar8->prods)._M_extent._M_extent_value;
      if (sVar3 != 0) {
        ppPVar9 = (pRVar8->prods)._M_ptr;
        ppPVar2 = ppPVar9 + sVar3;
        do {
          pPVar4 = *ppPVar9;
          switch(pPVar4->kind) {
          case Item:
            lVar5 = *(long *)(pPVar4 + 6);
            if (lVar5 != 0) {
              lVar6 = *(long *)(pPVar4 + 4);
              lVar10 = 0;
              do {
                Expression::
                visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                          (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),visitor
                          );
                lVar10 = lVar10 + 8;
              } while (lVar5 << 3 != lVar10);
            }
            break;
          case IfElse:
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                      (*(Expression **)(pPVar4 + 2),*(Expression **)(pPVar4 + 2),visitor);
            lVar5 = *(long *)(pPVar4 + 10);
            if (lVar5 != 0) {
              lVar6 = *(long *)(pPVar4 + 8);
              lVar10 = 0;
              do {
                Expression::
                visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                          (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),visitor
                          );
                lVar10 = lVar10 + 8;
              } while (lVar5 << 3 != lVar10);
            }
            if (((char)pPVar4[0x14].kind == CodeBlock) &&
               (lVar5 = *(long *)(pPVar4 + 0x12), lVar5 != 0)) {
              lVar6 = *(long *)(pPVar4 + 0x10);
              lVar10 = 0;
              do {
                Expression::
                visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                          (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),visitor
                          );
                lVar10 = lVar10 + 8;
              } while (lVar5 << 3 != lVar10);
            }
            break;
          case Repeat:
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                      (*(Expression **)(pPVar4 + 2),*(Expression **)(pPVar4 + 2),visitor);
            lVar5 = *(long *)(pPVar4 + 10);
            if (lVar5 != 0) {
              lVar6 = *(long *)(pPVar4 + 8);
              lVar10 = 0;
              do {
                Expression::
                visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                          (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),visitor
                          );
                lVar10 = lVar10 + 8;
              } while (lVar5 << 3 != lVar10);
            }
            break;
          case Case:
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                      (*(Expression **)(pPVar4 + 2),*(Expression **)(pPVar4 + 2),visitor);
            if (((char)pPVar4[0x10].kind == CodeBlock) &&
               (lVar5 = *(long *)(pPVar4 + 0xe), lVar5 != 0)) {
              lVar6 = *(long *)(pPVar4 + 0xc);
              lVar10 = 0;
              do {
                Expression::
                visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                          (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),visitor
                          );
                lVar10 = lVar10 + 8;
              } while (lVar5 << 3 != lVar10);
            }
            if (*(long *)(pPVar4 + 6) != 0) {
              plVar12 = *(long **)(pPVar4 + 4);
              plVar11 = plVar12 + *(long *)(pPVar4 + 6) * 6;
              do {
                lVar5 = plVar12[1];
                if (lVar5 != 0) {
                  lVar6 = *plVar12;
                  lVar10 = 0;
                  do {
                    Expression::
                    visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                              (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),
                               visitor);
                    lVar10 = lVar10 + 8;
                  } while (lVar5 << 3 != lVar10);
                }
                lVar5 = plVar12[5];
                if (lVar5 != 0) {
                  lVar6 = plVar12[4];
                  lVar10 = 0;
                  do {
                    Expression::
                    visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                              (*(Expression **)(lVar6 + lVar10),*(Expression **)(lVar6 + lVar10),
                               visitor);
                    lVar10 = lVar10 + 8;
                  } while (lVar5 << 3 != lVar10);
                }
                plVar12 = plVar12 + 6;
              } while (plVar12 != plVar11);
            }
          }
          ppPVar9 = ppPVar9 + 1;
        } while (ppPVar9 != ppPVar2);
      }
      pEVar7 = pRVar8->weightExpr;
      if (pEVar7 != (Expression *)0x0) {
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                  (pEVar7,pEVar7,visitor);
      }
      pEVar7 = pRVar8->randJoinExpr;
      if (pEVar7 != (Expression *)0x0) {
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::CheckerMemberVisitor&>
                  (pEVar7,pEVar7,visitor);
      }
      pRVar8 = pRVar8 + 1;
    } while (pRVar8 != pRVar1);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& rule : getRules()) {
            for (auto prod : rule.prods) {
                switch (prod->kind) {
                    case ProdKind::Item:
                        ((const ProdItem*)prod)->visitExprs(visitor);
                        break;
                    case ProdKind::CodeBlock:
                        break;
                    case ProdKind::IfElse: {
                        auto& iep = *(const IfElseProd*)prod;
                        iep.expr->visit(visitor);
                        iep.ifItem.visitExprs(visitor);
                        if (iep.elseItem)
                            iep.elseItem->visitExprs(visitor);
                        break;
                    }
                    case ProdKind::Repeat: {
                        auto& rp = *(const RepeatProd*)prod;
                        rp.expr->visit(visitor);
                        rp.item.visitExprs(visitor);
                        break;
                    }
                    case ProdKind::Case: {
                        auto& cp = *(const CaseProd*)prod;
                        cp.expr->visit(visitor);
                        if (cp.defaultItem)
                            cp.defaultItem->visitExprs(visitor);

                        for (auto& item : cp.items) {
                            for (auto expr : item.expressions)
                                expr->visit(visitor);

                            item.item.visitExprs(visitor);
                        }
                        break;
                    }
                }
            }

            if (rule.weightExpr)
                rule.weightExpr->visit(visitor);

            if (rule.randJoinExpr)
                rule.randJoinExpr->visit(visitor);
        }
    }